

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseCommandList(WastParser *this,Script *script,CommandPtrVector *commands)

{
  bool bVar1;
  Result RVar2;
  CommandPtr local_38;
  CommandPtr command;
  CommandPtrVector *commands_local;
  Script *script_local;
  WastParser *this_local;
  
  do {
    command._M_t.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Command,_std::default_delete<wabt::Command>,_true,_true>)
         PeekPair(this);
    bVar1 = anon_unknown_1::IsCommand
                      ((TokenTypePair)
                       command._M_t.
                       super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                       super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
    if (!bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::
    unique_ptr<std::default_delete<wabt::Command>,void>
              ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)&local_38);
    RVar2 = ParseCommand(this,script,&local_38);
    bVar1 = Succeeded(RVar2);
    if (bVar1) {
      std::
      vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
      ::push_back(commands,&local_38);
LAB_0031ce15:
      bVar1 = false;
    }
    else {
      RVar2 = Synchronize(this,anon_unknown_1::IsCommand);
      bVar1 = Failed(RVar2);
      if (!bVar1) goto LAB_0031ce15;
      Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::~unique_ptr(&local_38);
    if (bVar1) {
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseCommandList(Script* script,
                                    CommandPtrVector* commands) {
  WABT_TRACE(ParseCommandList);
  while (IsCommand(PeekPair())) {
    CommandPtr command;
    if (Succeeded(ParseCommand(script, &command))) {
      commands->push_back(std::move(command));
    } else {
      CHECK_RESULT(Synchronize(IsCommand));
    }
  }
  return Result::Ok;
}